

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O3

uint256 * jbcoin::getDirNodeIndex
                    (uint256 *__return_storage_ptr__,uint256 *uDirRoot,uint64_t uNodeIndex)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  unsigned_long *in_R8;
  undefined2 local_12;
  uint64_t local_10;
  
  if (uNodeIndex == 0) {
    uVar1 = *(undefined8 *)uDirRoot->pn;
    uVar2 = *(undefined8 *)(uDirRoot->pn + 2);
    uVar3 = *(undefined8 *)(uDirRoot->pn + 6);
    *(undefined8 *)(__return_storage_ptr__->pn + 4) = *(undefined8 *)(uDirRoot->pn + 4);
    *(undefined8 *)(__return_storage_ptr__->pn + 6) = uVar3;
    *(undefined8 *)__return_storage_ptr__->pn = uVar1;
    *(undefined8 *)(__return_storage_ptr__->pn + 2) = uVar2;
  }
  else {
    local_12 = 100;
    local_10 = uNodeIndex;
    sha512Half<unsigned_short,jbcoin::base_uint<256ul,void>,unsigned_long>
              (__return_storage_ptr__,(jbcoin *)&local_12,(unsigned_short *)uDirRoot,
               (base_uint<256UL,_void> *)&stack0xfffffffffffffff0,in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

uint256
getDirNodeIndex (uint256 const& uDirRoot, const std::uint64_t uNodeIndex)
{
    if (uNodeIndex == 0)
        return uDirRoot;

    return sha512Half(
        std::uint16_t(spaceDirNode),
        uDirRoot,
        std::uint64_t(uNodeIndex));
}